

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arrow_type_info.cpp
# Opt level: O0

unique_ptr<duckdb::ArrowListInfo,_std::default_delete<duckdb::ArrowListInfo>,_true>
duckdb::ArrowListInfo::List(shared_ptr<duckdb::ArrowType,_true> *child,ArrowVariableSizeType size)

{
  void *pvVar1;
  _Head_base<0UL,_duckdb::ArrowListInfo_*,_false> in_RDI;
  _Head_base<0UL,_duckdb::ArrowListInfo_*,_false> this;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffcc;
  ArrowListInfo *in_stack_ffffffffffffffd0;
  ArrowVariableSizeType size_00;
  
  this._M_head_impl = in_RDI._M_head_impl;
  pvVar1 = operator_new(0x20);
  size_00 = (ArrowVariableSizeType)((ulong)pvVar1 >> 0x38);
  uVar2 = CONCAT13(1,(int3)in_stack_ffffffffffffffc8);
  shared_ptr<duckdb::ArrowType,_true>::shared_ptr
            ((shared_ptr<duckdb::ArrowType,_true> *)this._M_head_impl,
             (shared_ptr<duckdb::ArrowType,_true> *)in_RDI._M_head_impl);
  ArrowListInfo(in_stack_ffffffffffffffd0,
                (shared_ptr<duckdb::ArrowType,_true> *)CONCAT44(in_stack_ffffffffffffffcc,uVar2),
                size_00);
  unique_ptr<duckdb::ArrowListInfo,std::default_delete<duckdb::ArrowListInfo>,true>::
  unique_ptr<std::default_delete<duckdb::ArrowListInfo>,void>
            ((unique_ptr<duckdb::ArrowListInfo,_std::default_delete<duckdb::ArrowListInfo>,_true> *)
             this._M_head_impl,in_RDI._M_head_impl);
  shared_ptr<duckdb::ArrowType,_true>::~shared_ptr((shared_ptr<duckdb::ArrowType,_true> *)0x1a273ed)
  ;
  return (unique_ptr<duckdb::ArrowListInfo,_std::default_delete<duckdb::ArrowListInfo>_>)
         (_Tuple_impl<0UL,_duckdb::ArrowListInfo_*,_std::default_delete<duckdb::ArrowListInfo>_>)
         this._M_head_impl;
}

Assistant:

unique_ptr<ArrowListInfo> ArrowListInfo::List(shared_ptr<ArrowType> child, ArrowVariableSizeType size) {
	D_ASSERT(size == ArrowVariableSizeType::SUPER_SIZE || size == ArrowVariableSizeType::NORMAL);
	return unique_ptr<ArrowListInfo>(new ArrowListInfo(std::move(child), size));
}